

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string *filename)

{
  int file_descriptor_00;
  char *__file;
  int *piVar1;
  bool bVar2;
  FileInputStream *result;
  int file_descriptor;
  string *filename_local;
  DiskSourceTree *this_local;
  
  do {
    __file = (char *)std::__cxx11::string::c_str();
    file_descriptor_00 = open(__file,0);
    bVar2 = false;
    if (file_descriptor_00 < 0) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  if (file_descriptor_00 < 0) {
    this_local = (DiskSourceTree *)0x0;
  }
  else {
    this_local = (DiskSourceTree *)operator_new(0x58);
    io::FileInputStream::FileInputStream((FileInputStream *)this_local,file_descriptor_00,-1);
    io::FileInputStream::SetCloseOnDelete((FileInputStream *)this_local,true);
  }
  return (ZeroCopyInputStream *)this_local;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    const string& filename) {
  int file_descriptor;
  do {
    file_descriptor = open(filename.c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return NULL;
  }
}